

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::check_done
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  basic_json_parser<wchar_t,_std::allocator<char>_> *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffb0;
  error_code *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar6;
  
  std::error_code::error_code(in_stack_ffffffffffffffb0);
  check_done(in_RDI,in_stack_ffffffffffffffb8);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  iVar3 = in_stack_ffffffffffffffe8;
  uVar4 = in_stack_ffffffffffffffec;
  uVar5 = in_stack_fffffffffffffff0;
  uVar6 = in_stack_fffffffffffffff4;
  (*(in_RDI->super_ser_context)._vptr_ser_context[3])();
  ec_00._4_4_ = uVar4;
  ec_00._M_value = iVar3;
  ec_00._M_cat._0_4_ = uVar5;
  ec_00._M_cat._4_4_ = uVar6;
  ser_error::ser_error
            ((ser_error *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),ec_00,
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffd0
            );
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void check_done()
    {
        std::error_code ec;
        check_done(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line_,column()));
        }
    }